

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::ExpandVariablesInString
          (cmMakefile *this,string *source,bool escapeQuotes,bool noEscapes,bool atOnly,
          char *filename,long line,bool removeEmpty,bool replaceAt)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  undefined1 local_218 [8];
  string msg_err;
  string msg_new;
  string msg_old;
  string msg_input;
  string local_168;
  cmAlphaNum local_148;
  undefined1 local_118 [8];
  string msg;
  undefined1 local_f0 [4];
  MessageType newError;
  string newErrorstr;
  string newResult;
  allocator<char> local_99;
  string local_98;
  string local_78 [8];
  string original;
  string errorstr;
  MessageType mtype;
  bool compareResults;
  bool replaceAt_local;
  bool removeEmpty_local;
  char *filename_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  cmMakefile *this_local;
  
  bVar1 = false;
  errorstr.field_2._8_4_ = 6;
  std::__cxx11::string::string((string *)(original.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  if ((atOnly) && ((!noEscapes || (!removeEmpty)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"ExpandVariablesInString @ONLY called on something with escapes."
               ,&local_99);
    IssueMessage(this,INTERNAL_ERROR,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    goto LAB_004177a7;
  }
  std::__cxx11::string::string((string *)(newErrorstr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  msg.field_2._12_4_ = 6;
  PVar2 = GetPolicyStatus(this,CMP0053,false);
  if (PVar2 == OLD) {
LAB_004172d2:
    errorstr.field_2._8_4_ =
         ExpandVariablesInStringOld
                   (this,(string *)((long)&original.field_2 + 8),source,escapeQuotes,noEscapes,
                    atOnly,filename,line,removeEmpty,true);
  }
  else {
    if (PVar2 == WARN) {
      std::__cxx11::string::operator=(local_78,(string *)source);
      std::__cxx11::string::operator=
                ((string *)(newErrorstr.field_2._M_local_buf + 8),(string *)source);
      bVar1 = true;
      this->SuppressSideEffects = true;
      msg.field_2._12_4_ =
           ExpandVariablesInStringNew
                     (this,(string *)local_f0,(string *)((long)&newErrorstr.field_2 + 8),
                      escapeQuotes,noEscapes,atOnly,filename,line,replaceAt);
      this->SuppressSideEffects = false;
      goto LAB_004172d2;
    }
    if (PVar2 - NEW < 3) {
      errorstr.field_2._8_4_ =
           ExpandVariablesInStringNew
                     (this,(string *)((long)&original.field_2 + 8),source,escapeQuotes,noEscapes,
                      atOnly,filename,line,replaceAt);
    }
  }
  if (errorstr.field_2._8_4_ == 6) {
    if ((bVar1) &&
       ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&newErrorstr.field_2 + 8),source), bVar1 ||
        (msg.field_2._12_4_ != 6)))) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_168,(cmPolicies *)0x35,id);
      cmAlphaNum::cmAlphaNum(&local_148,&local_168);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&msg_input.field_2 + 8),'\n');
      cmStrCat<>((string *)local_118,&local_148,(cmAlphaNum *)((long)&msg_input.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::string((string *)(msg_old.field_2._M_local_buf + 8),local_78);
      cmsys::SystemTools::ReplaceString((string *)((long)&msg_old.field_2 + 8),"\n","\n  ");
      std::__cxx11::string::operator+=((string *)local_118,"For input:\n  \'");
      std::__cxx11::string::operator+=
                ((string *)local_118,(string *)(msg_old.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_118,"\'\n");
      std::__cxx11::string::string((string *)(msg_new.field_2._M_local_buf + 8),(string *)source);
      cmsys::SystemTools::ReplaceString((string *)((long)&msg_new.field_2 + 8),"\n","\n  ");
      std::__cxx11::string::operator+=
                ((string *)local_118,"the old evaluation rules produce:\n  \'");
      std::__cxx11::string::operator+=
                ((string *)local_118,(string *)(msg_new.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_118,"\'\n");
      if (msg.field_2._12_4_ == 6) {
        std::__cxx11::string::string
                  ((string *)(msg_err.field_2._M_local_buf + 8),
                   (string *)(newErrorstr.field_2._M_local_buf + 8));
        cmsys::SystemTools::ReplaceString((string *)((long)&msg_err.field_2 + 8),"\n","\n  ");
        std::__cxx11::string::operator+=
                  ((string *)local_118,"but the new evaluation rules produce:\n  \'");
        std::__cxx11::string::operator+=
                  ((string *)local_118,(string *)(msg_err.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_118,"\'\n");
        std::__cxx11::string::~string((string *)(msg_err.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::string((string *)local_218,(string *)local_f0);
        cmsys::SystemTools::ReplaceString((string *)local_218,"\n","\n  ");
        std::__cxx11::string::operator+=
                  ((string *)local_118,"but the new evaluation rules produce an error:\n  ");
        std::__cxx11::string::operator+=((string *)local_118,(string *)local_218);
        std::__cxx11::string::operator+=((string *)local_118,"\n");
        std::__cxx11::string::~string((string *)local_218);
      }
      std::__cxx11::string::operator+=
                ((string *)local_118,
                 "Using the old result for compatibility since the policy is not set.");
      IssueMessage(this,AUTHOR_WARNING,(string *)local_118);
      std::__cxx11::string::~string((string *)(msg_new.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(msg_old.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  else {
    if (errorstr.field_2._8_4_ == 2) {
      cmSystemTools::SetFatalErrorOccurred();
    }
    IssueMessage(this,errorstr.field_2._8_4_,(string *)((long)&original.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(newErrorstr.field_2._M_local_buf + 8));
LAB_004177a7:
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(original.field_2._M_local_buf + 8));
  return source;
}

Assistant:

const std::string& cmMakefile::ExpandVariablesInString(
  std::string& source, bool escapeQuotes, bool noEscapes, bool atOnly,
  const char* filename, long line, bool removeEmpty, bool replaceAt) const
{
  bool compareResults = false;
  MessageType mtype = MessageType::LOG;
  std::string errorstr;
  std::string original;

  // Sanity check the @ONLY mode.
  if (atOnly && (!noEscapes || !removeEmpty)) {
    // This case should never be called.  At-only is for
    // configure-file/string which always does no escapes.
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "ExpandVariablesInString @ONLY called "
                       "on something with escapes.");
    return source;
  }

  // Variables used in the WARN case.
  std::string newResult;
  std::string newErrorstr;
  MessageType newError = MessageType::LOG;

  switch (this->GetPolicyStatus(cmPolicies::CMP0053)) {
    case cmPolicies::WARN: {
      // Save the original string for the warning.
      original = source;
      newResult = source;
      compareResults = true;
      // Suppress variable watches to avoid calling hooks twice. Suppress new
      // dereferences since the OLD behavior is still what is actually used.
      this->SuppressSideEffects = true;
      newError = this->ExpandVariablesInStringNew(
        newErrorstr, newResult, escapeQuotes, noEscapes, atOnly, filename,
        line, replaceAt);
      this->SuppressSideEffects = false;
      CM_FALLTHROUGH;
    }
    case cmPolicies::OLD:
      mtype = this->ExpandVariablesInStringOld(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, removeEmpty, true);
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    // Messaging here would be *very* verbose.
    case cmPolicies::NEW:
      mtype = this->ExpandVariablesInStringNew(errorstr, source, escapeQuotes,
                                               noEscapes, atOnly, filename,
                                               line, replaceAt);
      break;
  }

  // If it's an error in either case, just report the error...
  if (mtype != MessageType::LOG) {
    if (mtype == MessageType::FATAL_ERROR) {
      cmSystemTools::SetFatalErrorOccurred();
    }
    this->IssueMessage(mtype, errorstr);
  }
  // ...otherwise, see if there's a difference that needs to be warned about.
  else if (compareResults && (newResult != source || newError != mtype)) {
    std::string msg =
      cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0053), '\n');

    std::string msg_input = original;
    cmSystemTools::ReplaceString(msg_input, "\n", "\n  ");
    msg += "For input:\n  '";
    msg += msg_input;
    msg += "'\n";

    std::string msg_old = source;
    cmSystemTools::ReplaceString(msg_old, "\n", "\n  ");
    msg += "the old evaluation rules produce:\n  '";
    msg += msg_old;
    msg += "'\n";

    if (newError == mtype) {
      std::string msg_new = newResult;
      cmSystemTools::ReplaceString(msg_new, "\n", "\n  ");
      msg += "but the new evaluation rules produce:\n  '";
      msg += msg_new;
      msg += "'\n";
    } else {
      std::string msg_err = newErrorstr;
      cmSystemTools::ReplaceString(msg_err, "\n", "\n  ");
      msg += "but the new evaluation rules produce an error:\n  ";
      msg += msg_err;
      msg += "\n";
    }

    msg +=
      "Using the old result for compatibility since the policy is not set.";

    this->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  return source;
}